

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::time_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *func;
  string *name;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffd70;
  allocator *paVar2;
  string *in_stack_fffffffffffffd78;
  name_space *in_stack_fffffffffffffd80;
  name_space *this;
  undefined8 in_stack_fffffffffffffd90;
  types tVar3;
  _func_numeric_tm_ptr *in_stack_fffffffffffffd98;
  allocator local_1e1;
  string local_1e0 [47];
  undefined1 local_1b1 [48];
  allocator local_181;
  string local_180 [47];
  allocator local_151;
  string local_150 [47];
  allocator local_121;
  string local_120 [47];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [47];
  allocator local_91;
  string local_90 [47];
  allocator local_61;
  string local_60 [63];
  allocator local_21;
  string local_20 [32];
  
  tVar3 = (types)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"sec",&local_21);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"min",&local_61);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"hour",&local_91);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"wday",&local_c1);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"mday",&local_f1);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"yday",&local_121);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"mon",&local_151);
  cs::make_cni<cs::numeric(&)(tm_const&)>(in_stack_fffffffffffffd98,tVar3);
  func = cs::name_space::add_var
                   (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                    (var *)in_stack_fffffffffffffd70);
  paVar2 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"year",paVar2);
  tVar3 = (types)((ulong)paVar2 >> 0x20);
  cs::make_cni<cs::numeric(&)(tm_const&)>((_func_numeric_tm_ptr *)func,tVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  this = (name_space *)local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1b1 + 1),"is_dst",(allocator *)this);
  cs::make_cni<bool(&)(tm_const&)>((_func_bool_tm_ptr *)func,tVar3);
  name = (string *)
         cs::name_space::add_var(this,in_stack_fffffffffffffd78,(var *)in_stack_fffffffffffffd70);
  paVar2 = &local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"unixtime",paVar2);
  cs::make_cni<cs::numeric(&)(tm_const&)>((_func_numeric_tm_ptr *)func,tVar3);
  cs::name_space::add_var(this,name,(var *)paVar2);
  any::~any((any *)0x447338);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  any::~any((any *)0x44735f);
  std::__cxx11::string::~string((string *)(local_1b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  any::~any((any *)0x447386);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  any::~any((any *)0x4473ad);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  any::~any((any *)0x4473d4);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  any::~any((any *)0x4473fb);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  any::~any((any *)0x447422);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  any::~any((any *)0x447449);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  any::~any((any *)0x447470);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  any::~any((any *)0x447497);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			(*time_ext)
			.add_var("sec", make_cni(sec, callable::types::member_visitor))
			.add_var("min", make_cni(tm_min, callable::types::member_visitor))
			.add_var("hour", make_cni(hour, callable::types::member_visitor))
			.add_var("wday", make_cni(wday, callable::types::member_visitor))
			.add_var("mday", make_cni(mday, callable::types::member_visitor))
			.add_var("yday", make_cni(yday, callable::types::member_visitor))
			.add_var("mon", make_cni(mon, callable::types::member_visitor))
			.add_var("year", make_cni(year, callable::types::member_visitor))
			.add_var("is_dst", make_cni(is_dst, callable::types::member_visitor))
			.add_var("unixtime", make_cni(unixtime, callable::types::member_visitor));
		}